

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint32_t uVar25;
  uint uVar26;
  void *p;
  size_t sVar27;
  char cVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t __n;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  int *piVar35;
  uint uVar36;
  long lVar37;
  bool bVar38;
  int iVar49;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long lVar50;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar72;
  undefined1 auVar70 [16];
  int iVar73;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint32_t histogram [272];
  uint8_t depths [272];
  uint16_t bits [272];
  undefined4 local_7a8;
  char acStack_7a4 [1084];
  byte local_368 [272];
  uint16_t local_258 [276];
  long lVar53;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters == 1) {
    return;
  }
  p = BrotliAllocate(m,context_map_size * 4);
  uVar29 = *context_map;
  if (1 < context_map_size) {
    sVar27 = 1;
    do {
      if (uVar29 < context_map[sVar27]) {
        uVar29 = context_map[sVar27];
      }
      sVar27 = sVar27 + 1;
    } while (context_map_size != sVar27);
  }
  if (0xff < uVar29) {
    __assert_fail("max_value < 256u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                  ,0x26e,
                  "void MoveToFrontTransform(const uint32_t *restrict, const size_t, uint32_t *)");
  }
  auVar39._4_4_ = 0;
  auVar39._0_4_ = uVar29;
  auVar39._8_4_ = uVar29;
  auVar39._12_4_ = 0;
  uVar30 = 0;
  auVar40 = auVar39;
  auVar52 = _DAT_0013a8c0;
  auVar54 = _DAT_0013a8d0;
  auVar55 = _DAT_0013a8e0;
  auVar56 = _DAT_0013a8f0;
  auVar57 = _DAT_00139f30;
  auVar58 = _DAT_00139f40;
  auVar59 = _DAT_00139160;
  auVar60 = _DAT_00139170;
  do {
    auVar70 = auVar39 ^ _DAT_00139180;
    auVar74 = auVar60 ^ _DAT_00139180;
    iVar49 = auVar70._0_4_;
    iVar87 = -(uint)(iVar49 < auVar74._0_4_);
    iVar51 = auVar70._4_4_;
    auVar76._4_4_ = -(uint)(iVar51 < auVar74._4_4_);
    iVar72 = auVar70._8_4_;
    iVar91 = -(uint)(iVar72 < auVar74._8_4_);
    iVar73 = auVar70._12_4_;
    auVar76._12_4_ = -(uint)(iVar73 < auVar74._12_4_);
    auVar70._4_4_ = iVar87;
    auVar70._0_4_ = iVar87;
    auVar70._8_4_ = iVar91;
    auVar70._12_4_ = iVar91;
    auVar70 = pshuflw(auVar40,auVar70,0xe8);
    auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar51);
    auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar73);
    auVar75._0_4_ = auVar75._4_4_;
    auVar75._8_4_ = auVar75._12_4_;
    auVar61 = pshuflw(in_XMM11,auVar75,0xe8);
    auVar76._0_4_ = auVar76._4_4_;
    auVar76._8_4_ = auVar76._12_4_;
    auVar74 = pshuflw(auVar70,auVar76,0xe8);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar40 = (auVar74 | auVar61 & auVar70) ^ auVar40;
    auVar40 = packssdw(auVar40,auVar40);
    cVar28 = (char)uVar30;
    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)&local_7a8 + uVar30) = cVar28;
    }
    auVar61._4_4_ = iVar87;
    auVar61._0_4_ = iVar87;
    auVar61._8_4_ = iVar91;
    auVar61._12_4_ = iVar91;
    auVar76 = auVar75 & auVar61 | auVar76;
    auVar40 = packssdw(auVar76,auVar76);
    auVar74._8_4_ = 0xffffffff;
    auVar74._0_8_ = 0xffffffffffffffff;
    auVar74._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar74,auVar40 ^ auVar74);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 8 & 1) != 0) {
      *(char *)((long)&local_7a8 + uVar30 + 1) = cVar28 + '\x01';
    }
    auVar40 = auVar59 ^ _DAT_00139180;
    auVar62._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar62._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar62._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar62._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar77._4_4_ = auVar62._0_4_;
    auVar77._0_4_ = auVar62._0_4_;
    auVar77._8_4_ = auVar62._8_4_;
    auVar77._12_4_ = auVar62._8_4_;
    iVar87 = -(uint)(auVar40._4_4_ == iVar51);
    iVar91 = -(uint)(auVar40._12_4_ == iVar73);
    auVar12._4_4_ = iVar87;
    auVar12._0_4_ = iVar87;
    auVar12._8_4_ = iVar91;
    auVar12._12_4_ = iVar91;
    auVar88._4_4_ = auVar62._4_4_;
    auVar88._0_4_ = auVar62._4_4_;
    auVar88._8_4_ = auVar62._12_4_;
    auVar88._12_4_ = auVar62._12_4_;
    auVar40 = auVar12 & auVar77 | auVar88;
    auVar40 = packssdw(auVar40,auVar40);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar3,auVar40 ^ auVar3);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
      *(char *)((long)&local_7a8 + uVar30 + 2) = cVar28 + '\x02';
    }
    auVar40 = pshufhw(auVar40,auVar77,0x84);
    auVar13._4_4_ = iVar87;
    auVar13._0_4_ = iVar87;
    auVar13._8_4_ = iVar91;
    auVar13._12_4_ = iVar91;
    auVar74 = pshufhw(auVar62,auVar13,0x84);
    auVar70 = pshufhw(auVar40,auVar88,0x84);
    auVar41._8_4_ = 0xffffffff;
    auVar41._0_8_ = 0xffffffffffffffff;
    auVar41._12_4_ = 0xffffffff;
    auVar41 = (auVar70 | auVar74 & auVar40) ^ auVar41;
    auVar40 = packssdw(auVar41,auVar41);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
      *(char *)((long)&local_7a8 + uVar30 + 3) = cVar28 + '\x03';
    }
    auVar40 = auVar58 ^ _DAT_00139180;
    auVar63._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar63._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar63._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar63._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar14._4_4_ = auVar63._0_4_;
    auVar14._0_4_ = auVar63._0_4_;
    auVar14._8_4_ = auVar63._8_4_;
    auVar14._12_4_ = auVar63._8_4_;
    auVar74 = pshuflw(auVar88,auVar14,0xe8);
    auVar42._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
    auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
    auVar42._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
    auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
    auVar78._4_4_ = auVar42._4_4_;
    auVar78._0_4_ = auVar42._4_4_;
    auVar78._8_4_ = auVar42._12_4_;
    auVar78._12_4_ = auVar42._12_4_;
    auVar40 = pshuflw(auVar42,auVar78,0xe8);
    auVar79._4_4_ = auVar63._4_4_;
    auVar79._0_4_ = auVar63._4_4_;
    auVar79._8_4_ = auVar63._12_4_;
    auVar79._12_4_ = auVar63._12_4_;
    auVar70 = pshuflw(auVar63,auVar79,0xe8);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 & auVar74,(auVar70 | auVar40 & auVar74) ^ auVar4);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_7a4[uVar30] = cVar28 + '\x04';
    }
    auVar15._4_4_ = auVar63._0_4_;
    auVar15._0_4_ = auVar63._0_4_;
    auVar15._8_4_ = auVar63._8_4_;
    auVar15._12_4_ = auVar63._8_4_;
    auVar79 = auVar78 & auVar15 | auVar79;
    auVar70 = packssdw(auVar79,auVar79);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40,auVar70 ^ auVar5);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._4_2_ >> 8 & 1) != 0) {
      acStack_7a4[uVar30 + 1] = cVar28 + '\x05';
    }
    auVar40 = auVar57 ^ _DAT_00139180;
    auVar64._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar64._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar64._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar64._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar80._4_4_ = auVar64._0_4_;
    auVar80._0_4_ = auVar64._0_4_;
    auVar80._8_4_ = auVar64._8_4_;
    auVar80._12_4_ = auVar64._8_4_;
    iVar87 = -(uint)(auVar40._4_4_ == iVar51);
    iVar91 = -(uint)(auVar40._12_4_ == iVar73);
    auVar16._4_4_ = iVar87;
    auVar16._0_4_ = iVar87;
    auVar16._8_4_ = iVar91;
    auVar16._12_4_ = iVar91;
    auVar89._4_4_ = auVar64._4_4_;
    auVar89._0_4_ = auVar64._4_4_;
    auVar89._8_4_ = auVar64._12_4_;
    auVar89._12_4_ = auVar64._12_4_;
    auVar40 = auVar16 & auVar80 | auVar89;
    auVar40 = packssdw(auVar40,auVar40);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_7a4[uVar30 + 2] = cVar28 + '\x06';
    }
    auVar40 = pshufhw(auVar40,auVar80,0x84);
    auVar17._4_4_ = iVar87;
    auVar17._0_4_ = iVar87;
    auVar17._8_4_ = iVar91;
    auVar17._12_4_ = iVar91;
    auVar74 = pshufhw(auVar64,auVar17,0x84);
    auVar70 = pshufhw(auVar40,auVar89,0x84);
    auVar43._8_4_ = 0xffffffff;
    auVar43._0_8_ = 0xffffffffffffffff;
    auVar43._12_4_ = 0xffffffff;
    auVar43 = (auVar70 | auVar74 & auVar40) ^ auVar43;
    auVar40 = packssdw(auVar43,auVar43);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._6_2_ >> 8 & 1) != 0) {
      acStack_7a4[uVar30 + 3] = cVar28 + '\a';
    }
    auVar40 = auVar56 ^ _DAT_00139180;
    auVar65._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar65._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar65._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar65._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar18._4_4_ = auVar65._0_4_;
    auVar18._0_4_ = auVar65._0_4_;
    auVar18._8_4_ = auVar65._8_4_;
    auVar18._12_4_ = auVar65._8_4_;
    auVar74 = pshuflw(auVar89,auVar18,0xe8);
    auVar44._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
    auVar44._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
    auVar44._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
    auVar44._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
    auVar81._4_4_ = auVar44._4_4_;
    auVar81._0_4_ = auVar44._4_4_;
    auVar81._8_4_ = auVar44._12_4_;
    auVar81._12_4_ = auVar44._12_4_;
    auVar40 = pshuflw(auVar44,auVar81,0xe8);
    auVar82._4_4_ = auVar65._4_4_;
    auVar82._0_4_ = auVar65._4_4_;
    auVar82._8_4_ = auVar65._12_4_;
    auVar82._12_4_ = auVar65._12_4_;
    auVar70 = pshuflw(auVar65,auVar82,0xe8);
    auVar66._8_4_ = 0xffffffff;
    auVar66._0_8_ = 0xffffffffffffffff;
    auVar66._12_4_ = 0xffffffff;
    auVar66 = (auVar70 | auVar40 & auVar74) ^ auVar66;
    auVar70 = packssdw(auVar66,auVar66);
    auVar40 = packsswb(auVar40 & auVar74,auVar70);
    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      acStack_7a4[uVar30 + 4] = cVar28 + '\b';
    }
    auVar19._4_4_ = auVar65._0_4_;
    auVar19._0_4_ = auVar65._0_4_;
    auVar19._8_4_ = auVar65._8_4_;
    auVar19._12_4_ = auVar65._8_4_;
    auVar82 = auVar81 & auVar19 | auVar82;
    auVar70 = packssdw(auVar82,auVar82);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar70 = packssdw(auVar70 ^ auVar7,auVar70 ^ auVar7);
    auVar40 = packsswb(auVar40,auVar70);
    if ((auVar40._8_2_ >> 8 & 1) != 0) {
      acStack_7a4[uVar30 + 5] = cVar28 + '\t';
    }
    auVar40 = auVar55 ^ _DAT_00139180;
    auVar67._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar67._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar67._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar67._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar83._4_4_ = auVar67._0_4_;
    auVar83._0_4_ = auVar67._0_4_;
    auVar83._8_4_ = auVar67._8_4_;
    auVar83._12_4_ = auVar67._8_4_;
    iVar87 = -(uint)(auVar40._4_4_ == iVar51);
    iVar91 = -(uint)(auVar40._12_4_ == iVar73);
    auVar20._4_4_ = iVar87;
    auVar20._0_4_ = iVar87;
    auVar20._8_4_ = iVar91;
    auVar20._12_4_ = iVar91;
    auVar90._4_4_ = auVar67._4_4_;
    auVar90._0_4_ = auVar67._4_4_;
    auVar90._8_4_ = auVar67._12_4_;
    auVar90._12_4_ = auVar67._12_4_;
    auVar40 = auVar20 & auVar83 | auVar90;
    auVar40 = packssdw(auVar40,auVar40);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar8,auVar40 ^ auVar8);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      acStack_7a4[uVar30 + 6] = cVar28 + '\n';
    }
    auVar40 = pshufhw(auVar40,auVar83,0x84);
    auVar21._4_4_ = iVar87;
    auVar21._0_4_ = iVar87;
    auVar21._8_4_ = iVar91;
    auVar21._12_4_ = iVar91;
    auVar74 = pshufhw(auVar67,auVar21,0x84);
    auVar70 = pshufhw(auVar40,auVar90,0x84);
    auVar45._8_4_ = 0xffffffff;
    auVar45._0_8_ = 0xffffffffffffffff;
    auVar45._12_4_ = 0xffffffff;
    auVar45 = (auVar70 | auVar74 & auVar40) ^ auVar45;
    auVar40 = packssdw(auVar45,auVar45);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._10_2_ >> 8 & 1) != 0) {
      acStack_7a4[uVar30 + 7] = cVar28 + '\v';
    }
    auVar40 = auVar54 ^ _DAT_00139180;
    auVar68._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar68._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar68._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar68._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar22._4_4_ = auVar68._0_4_;
    auVar22._0_4_ = auVar68._0_4_;
    auVar22._8_4_ = auVar68._8_4_;
    auVar22._12_4_ = auVar68._8_4_;
    auVar74 = pshuflw(auVar90,auVar22,0xe8);
    auVar46._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
    auVar46._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
    auVar46._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
    auVar46._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
    auVar84._4_4_ = auVar46._4_4_;
    auVar84._0_4_ = auVar46._4_4_;
    auVar84._8_4_ = auVar46._12_4_;
    auVar84._12_4_ = auVar46._12_4_;
    auVar40 = pshuflw(auVar46,auVar84,0xe8);
    auVar85._4_4_ = auVar68._4_4_;
    auVar85._0_4_ = auVar68._4_4_;
    auVar85._8_4_ = auVar68._12_4_;
    auVar85._12_4_ = auVar68._12_4_;
    auVar70 = pshuflw(auVar68,auVar85,0xe8);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 & auVar74,(auVar70 | auVar40 & auVar74) ^ auVar9);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      acStack_7a4[uVar30 + 8] = cVar28 + '\f';
    }
    auVar23._4_4_ = auVar68._0_4_;
    auVar23._0_4_ = auVar68._0_4_;
    auVar23._8_4_ = auVar68._8_4_;
    auVar23._12_4_ = auVar68._8_4_;
    auVar85 = auVar84 & auVar23 | auVar85;
    auVar70 = packssdw(auVar85,auVar85);
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40,auVar70 ^ auVar10);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._12_2_ >> 8 & 1) != 0) {
      acStack_7a4[uVar30 + 9] = cVar28 + '\r';
    }
    auVar40 = auVar52 ^ _DAT_00139180;
    auVar69._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
    auVar69._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
    auVar69._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
    auVar69._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
    auVar86._4_4_ = auVar69._0_4_;
    auVar86._0_4_ = auVar69._0_4_;
    auVar86._8_4_ = auVar69._8_4_;
    auVar86._12_4_ = auVar69._8_4_;
    iVar49 = -(uint)(auVar40._4_4_ == iVar51);
    iVar51 = -(uint)(auVar40._12_4_ == iVar73);
    auVar71._4_4_ = iVar49;
    auVar71._0_4_ = iVar49;
    auVar71._8_4_ = iVar51;
    auVar71._12_4_ = iVar51;
    auVar47._4_4_ = auVar69._4_4_;
    auVar47._0_4_ = auVar69._4_4_;
    auVar47._8_4_ = auVar69._12_4_;
    auVar47._12_4_ = auVar69._12_4_;
    auVar47 = auVar71 & auVar86 | auVar47;
    auVar40 = packssdw(auVar47,auVar47);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar11,auVar40 ^ auVar11);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      acStack_7a4[uVar30 + 10] = cVar28 + '\x0e';
    }
    auVar40 = pshufhw(auVar40,auVar86,0x84);
    in_XMM11 = pshufhw(auVar69,auVar71,0x84);
    in_XMM11 = in_XMM11 & auVar40;
    auVar24._4_4_ = auVar69._4_4_;
    auVar24._0_4_ = auVar69._4_4_;
    auVar24._8_4_ = auVar69._12_4_;
    auVar24._12_4_ = auVar69._12_4_;
    auVar40 = pshufhw(auVar40,auVar24,0x84);
    auVar48._8_4_ = 0xffffffff;
    auVar48._0_8_ = 0xffffffffffffffff;
    auVar48._12_4_ = 0xffffffff;
    auVar48 = (auVar40 | in_XMM11) ^ auVar48;
    auVar40 = packssdw(auVar48,auVar48);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._14_2_ >> 8 & 1) != 0) {
      acStack_7a4[uVar30 + 0xb] = cVar28 + '\x0f';
    }
    uVar30 = uVar30 + 0x10;
    lVar37 = (long)DAT_0013a900;
    lVar53 = auVar60._8_8_;
    auVar60._0_8_ = auVar60._0_8_ + lVar37;
    lVar50 = DAT_0013a900._8_8_;
    auVar60._8_8_ = lVar53 + lVar50;
    lVar53 = auVar59._8_8_;
    auVar59._0_8_ = auVar59._0_8_ + lVar37;
    auVar59._8_8_ = lVar53 + lVar50;
    lVar53 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + lVar37;
    auVar58._8_8_ = lVar53 + lVar50;
    lVar53 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + lVar37;
    auVar57._8_8_ = lVar53 + lVar50;
    lVar53 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + lVar37;
    auVar56._8_8_ = lVar53 + lVar50;
    lVar53 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + lVar37;
    auVar55._8_8_ = lVar53 + lVar50;
    lVar53 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + lVar37;
    auVar54._8_8_ = lVar53 + lVar50;
    lVar53 = auVar52._8_8_;
    auVar52._0_8_ = auVar52._0_8_ + lVar37;
    auVar52._8_8_ = lVar53 + lVar50;
    auVar40 = _DAT_0013a900;
  } while ((uVar29 + 0x10 & 0x3f0) != uVar30);
  if (context_map_size != 0) {
    sVar27 = 0;
    do {
      uVar25 = context_map[sVar27];
      __n = 0;
      while (*(char *)((long)&local_7a8 + __n) != (char)uVar25) {
        __n = __n + 1;
        if (uVar29 + 1 == __n) goto LAB_00118c1e;
      }
      if (uVar29 + 1 <= __n) {
LAB_00118c1e:
        __assert_fail("index < mtf_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                      ,0x276,
                      "void MoveToFrontTransform(const uint32_t *restrict, const size_t, uint32_t *)"
                     );
      }
      *(int *)((long)p + sVar27 * 4) = (int)__n;
      if (__n != 0) {
        memmove((void *)((long)&local_7a8 + 1),&local_7a8,__n);
      }
      local_7a8._0_1_ = (char)uVar25;
      sVar27 = sVar27 + 1;
    } while (sVar27 != context_map_size);
    uVar29 = 0;
    uVar30 = 0;
    do {
      uVar31 = uVar30 + 1;
      if (uVar30 + 1 < context_map_size) {
        uVar31 = context_map_size;
      }
      piVar35 = (int *)((long)p + uVar30 * 4);
      while (*(int *)((long)p + uVar30 * 4) != 0) {
        uVar30 = uVar30 + 1;
        piVar35 = piVar35 + 1;
        if (uVar31 == uVar30) {
          uVar36 = 0;
          goto LAB_0011894d;
        }
      }
      uVar36 = 0;
      if (uVar30 < context_map_size) {
        lVar37 = 0;
        while (*piVar35 == 0) {
          lVar37 = lVar37 + -1;
          piVar35 = piVar35 + 1;
          if (uVar30 - context_map_size == lVar37) {
            uVar36 = (int)context_map_size - (int)uVar30;
LAB_0011894d:
            if (uVar29 < uVar36) {
              uVar29 = uVar36;
            }
            goto LAB_00118952;
          }
        }
        uVar30 = uVar30 - lVar37;
        uVar36 = -(int)lVar37;
      }
      if (uVar29 < uVar36) {
        uVar29 = uVar36;
      }
    } while (uVar30 < context_map_size);
LAB_00118952:
    if (uVar29 != 0) {
      uVar36 = 0x1f;
      if (uVar29 != 0) {
        for (; uVar29 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      goto LAB_0011895d;
    }
  }
  uVar36 = 0;
LAB_0011895d:
  uVar30 = 6;
  if (uVar36 < 6) {
    uVar30 = (ulong)uVar36;
  }
  uVar29 = (uint)uVar30;
  if (context_map_size == 0) {
    uVar33 = 0;
    memset(&local_7a8,0,0x440);
    bVar38 = true;
  }
  else {
    uVar26 = 2 << ((byte)uVar30 & 0x1f);
    uVar33 = 0;
    uVar31 = 0;
    do {
      if (uVar31 < uVar33) {
        __assert_fail("*out_size <= i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                      ,0x296,
                      "void RunLengthCodeZeros(const size_t, uint32_t *restrict, size_t *restrict, uint32_t *restrict)"
                     );
      }
      iVar49 = *(int *)((long)p + uVar31 * 4);
      if (iVar49 == 0) {
        uVar34 = 1;
        uVar32 = uVar31 + 1;
        if (context_map_size <= uVar31 + 1) {
LAB_001189fa:
          uVar31 = uVar32;
          if (uVar26 <= uVar34) goto code_r0x001189fe;
          uVar2 = 0x1f;
          if (uVar34 != 0) {
            for (; uVar34 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          *(uint *)((long)p + uVar33 * 4) = ((-1 << ((byte)uVar2 & 0x1f)) + uVar34) * 0x200 | uVar2;
          goto LAB_001189ab;
        }
        uVar34 = (int)context_map_size - (int)uVar31;
        lVar37 = 1;
        do {
          if (*(int *)((long)p + lVar37 * 4 + uVar31 * 4) != 0) {
            uVar34 = (uint)lVar37;
            break;
          }
          lVar37 = lVar37 + 1;
        } while (context_map_size - uVar31 != lVar37);
        uVar31 = uVar31 + uVar34;
        uVar32 = uVar31;
        if (uVar34 != 0) goto LAB_001189fa;
      }
      else {
        *(uint *)((long)p + uVar33 * 4) = iVar49 + uVar29;
        uVar31 = uVar31 + 1;
LAB_001189ab:
        uVar33 = uVar33 + 1;
      }
LAB_001189ae:
    } while (uVar31 < context_map_size);
    memset(&local_7a8,0,0x440);
    bVar38 = uVar33 == 0;
    if (bVar38) {
      bVar38 = true;
      uVar33 = 0;
    }
    else {
      uVar31 = 0;
      do {
        (&local_7a8)[*(uint *)((long)p + uVar31 * 4) & 0x1ff] =
             (&local_7a8)[*(uint *)((long)p + uVar31 * 4) & 0x1ff] + 1;
        uVar31 = uVar31 + 1;
      } while (uVar33 != uVar31);
    }
  }
  uVar32 = *storage_ix;
  uVar31 = uVar32 + 1;
  *(ulong *)(storage + (uVar32 >> 3)) =
       (ulong)(uVar36 != 0) << ((byte)uVar32 & 7) | (ulong)storage[uVar32 >> 3];
  *storage_ix = uVar31;
  if (uVar36 != 0) {
    *(ulong *)(storage + (uVar31 >> 3)) =
         (ulong)(uVar29 - 1) << ((byte)uVar31 & 7) | (ulong)storage[uVar31 >> 3];
    *storage_ix = uVar32 + 5;
  }
  BuildAndStoreHuffmanTree
            (&local_7a8,uVar30 + num_clusters,tree,local_368,local_258,storage_ix,storage);
  uVar30 = *storage_ix;
  if (!bVar38) {
    uVar31 = 0;
    do {
      uVar36 = *(uint *)((long)p + uVar31 * 4);
      uVar26 = uVar36 & 0x1ff;
      uVar32 = (ulong)uVar26;
      bVar1 = local_368[uVar32];
      if (local_258[uVar32] >> (bVar1 & 0x3f) != 0) {
LAB_00118c5c:
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < bVar1) {
LAB_00118c3d:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *(ulong *)(storage + (uVar30 >> 3)) =
           (ulong)local_258[uVar32] << ((byte)uVar30 & 7) | (ulong)storage[uVar30 >> 3];
      uVar30 = bVar1 + uVar30;
      *storage_ix = uVar30;
      if (uVar26 - 1 < uVar29) {
        uVar36 = uVar36 >> 9;
        if (uVar36 >> ((byte)uVar26 & 0x3f) != 0) goto LAB_00118c5c;
        if (0x38 < uVar26) goto LAB_00118c3d;
        *(ulong *)(storage + (uVar30 >> 3)) =
             (ulong)uVar36 << ((byte)uVar30 & 7) | (ulong)storage[uVar30 >> 3];
        uVar30 = uVar30 + uVar32;
        *storage_ix = uVar30;
      }
      uVar31 = uVar31 + 1;
    } while (uVar33 != uVar31);
  }
  *(ulong *)(storage + (uVar30 >> 3)) = (ulong)storage[uVar30 >> 3] | 1L << ((byte)uVar30 & 7);
  *storage_ix = uVar30 + 1;
  BrotliFree(m,p);
  return;
code_r0x001189fe:
  *(uint *)((long)p + uVar33 * 4) = ~(-1 << ((byte)uVar30 & 0x1f)) << 9 | uVar29;
  uVar33 = uVar33 + 1;
  uVar34 = (uVar34 - uVar26) + 1;
  uVar32 = uVar31;
  if (uVar34 == 0) goto LAB_001189ae;
  goto LAB_001189fa;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}